

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O0

string * __thiscall Catch::AssertionResult::getExpandedExpression_abi_cxx11_(AssertionResult *this)

{
  long in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string(in_RDI,(string *)(in_RSI + 0x70));
  return in_RDI;
}

Assistant:

std::string AssertionResult::getExpandedExpression() const {
        return m_resultData.reconstructedExpression;
    }